

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O3

void send_cb(uv_udp_send_t *req,int status)

{
  send_cb_called = send_cb_called + 1;
  return;
}

Assistant:

static void send_cb(uv_udp_send_t* req, int status) {
  ASSERT_NOT_NULL(req);
  ASSERT(status == 0);

  send_cb_called++;
  uv_close((uv_handle_t*)req->handle, close_cb);
}